

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::PrimitiveBoundingBoxTests::init
          (PrimitiveBoundingBoxTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  uint flags_00;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  QueryCase *pQVar4;
  TestNode *node;
  GridRenderCase *this_00;
  LineRenderCase *this_01;
  PointRenderCase *this_02;
  DepthDrawCase *this_03;
  long lVar5;
  BlitFboCase *pBVar6;
  ClearCase *pCVar7;
  ViewportCallOrderCase *pVVar8;
  TestCaseGroup *callOrderGroup;
  TestCaseGroup *clearGroup;
  TestCaseGroup *blitFboGroup;
  int caseNdx;
  TestCaseGroup *group;
  int depthNdx;
  TestCaseGroup *depthGroup;
  deUint32 flags;
  int usageNdx;
  TestCaseGroup *pipelineGroup;
  int pipelineConfigNdx;
  TestCaseGroup *methodGroup;
  int stateSetMethodNdx;
  TestCaseGroup *primitiveGroup;
  int primitiveTypeNdx;
  TestCaseGroup *stateQueryGroup;
  anon_struct_24_4_bfc3502d primitiveTypes [5];
  PrimitiveBoundingBoxTests *this_local;
  
  primitiveTypes[4].description = (char *)0x40000000002;
  primitiveTypes[3]._16_8_ = anon_var_dwarf_1d277e8;
  primitiveTypes[4].name = "Wide point render tests";
  primitiveTypes[3].name = "Wide line render tests";
  primitiveTypes[3].description = (char *)0x40000000001;
  primitiveTypes[2].description = (char *)0x2;
  primitiveTypes[2]._16_8_ = anon_var_dwarf_1d277ba;
  primitiveTypes[1]._16_8_ = (long)"Draw primitive: points" + 0x10;
  primitiveTypes[2].name = "Point render tests";
  primitiveTypes[1].name = "Line render tests";
  primitiveTypes[1].description = &DAT_00000001;
  primitiveTypes[0].description = (char *)0x0;
  primitiveTypes[0]._16_8_ = (long)"Test sanity of the value of GL_SAMPLES, with lines" + 0x2d;
  primitiveTypes[0].name = "Triangle render tests";
  primitiveTypes[4]._16_8_ = this;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"state_query",
             "State queries");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x78);
  anon_unknown_1::InitialValueCase::InitialValueCase
            ((InitialValueCase *)pTVar3,(this->super_TestCaseGroup).m_context,"initial_value",
             "Initial value case");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pQVar4 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar4,(this->super_TestCaseGroup).m_context,"getfloat","getFloatv",QUERY_FLOAT);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pQVar4);
  pQVar4 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar4,(this->super_TestCaseGroup).m_context,"getboolean","getBooleanv",QUERY_BOOLEAN);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pQVar4);
  pQVar4 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar4,(this->super_TestCaseGroup).m_context,"getinteger","getIntegerv",QUERY_INT);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pQVar4);
  pQVar4 = (QueryCase *)operator_new(0x80);
  anon_unknown_1::QueryCase::QueryCase
            (pQVar4,(this->super_TestCaseGroup).m_context,"getinteger64","getInteger64v",QUERY_INT64
            );
  tcu::TestNode::addChild(pTVar2,(TestNode *)pQVar4);
  for (primitiveGroup._0_4_ = 0; (int)primitiveGroup < 5;
      primitiveGroup._0_4_ = (int)primitiveGroup + 1) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               *(char **)&primitiveTypes[(long)(int)primitiveGroup + -1].type,
               primitiveTypes[(int)primitiveGroup].name);
    tcu::TestNode::addChild((TestNode *)this,pTVar2);
    for (methodGroup._4_4_ = 0; methodGroup._4_4_ < 3; methodGroup._4_4_ = methodGroup._4_4_ + 1) {
      pTVar3 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar3,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 init::stateSetMethods[methodGroup._4_4_].name,
                 init::stateSetMethods[methodGroup._4_4_].description);
      tcu::TestNode::addChild(pTVar2,pTVar3);
      for (pipelineGroup._4_4_ = 0; pipelineGroup._4_4_ < 4;
          pipelineGroup._4_4_ = pipelineGroup._4_4_ + 1) {
        if (((init::stateSetMethods[methodGroup._4_4_].methodFlags & 0x100) == 0) ||
           ((init::pipelineConfigs[pipelineGroup._4_4_].stageFlags & 0x20) != 0)) {
          node = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)node,
                     (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                     init::pipelineConfigs[pipelineGroup._4_4_].name,
                     init::pipelineConfigs[pipelineGroup._4_4_].description);
          tcu::TestNode::addChild(pTVar3,node);
          for (depthGroup._4_4_ = 0; depthGroup._4_4_ < 8; depthGroup._4_4_ = depthGroup._4_4_ + 1)
          {
            flags_00 = *(uint *)((long)&primitiveTypes[(int)primitiveGroup].description + 4) |
                       init::stateSetMethods[methodGroup._4_4_].methodFlags |
                       init::pipelineConfigs[pipelineGroup._4_4_].stageFlags |
                       init::usageConfigs[depthGroup._4_4_].flags;
            if (((init::usageConfigs[depthGroup._4_4_].invalidFlags == 0) ||
                ((flags_00 & init::usageConfigs[depthGroup._4_4_].invalidFlags) == 0)) &&
               ((init::usageConfigs[depthGroup._4_4_].requiredFlags == 0 ||
                ((flags_00 & init::usageConfigs[depthGroup._4_4_].requiredFlags) != 0)))) {
              iVar1 = *(int *)&primitiveTypes[(int)primitiveGroup].description;
              if (iVar1 == 0) {
                this_00 = (GridRenderCase *)operator_new(0xd8);
                anon_unknown_1::GridRenderCase::GridRenderCase
                          (this_00,(this->super_TestCaseGroup).m_context,
                           init::usageConfigs[depthGroup._4_4_].name,
                           init::usageConfigs[depthGroup._4_4_].description,flags_00);
                tcu::TestNode::addChild(node,(TestNode *)this_00);
              }
              else if (iVar1 == 1) {
                this_01 = (LineRenderCase *)operator_new(0xe0);
                anon_unknown_1::LineRenderCase::LineRenderCase
                          (this_01,(this->super_TestCaseGroup).m_context,
                           init::usageConfigs[depthGroup._4_4_].name,
                           init::usageConfigs[depthGroup._4_4_].description,flags_00);
                tcu::TestNode::addChild(node,(TestNode *)this_01);
              }
              else if (iVar1 == 2) {
                this_02 = (PointRenderCase *)operator_new(0xf8);
                anon_unknown_1::PointRenderCase::PointRenderCase
                          (this_02,(this->super_TestCaseGroup).m_context,
                           init::usageConfigs[depthGroup._4_4_].name,
                           init::usageConfigs[depthGroup._4_4_].description,flags_00);
                tcu::TestNode::addChild(node,(TestNode *)this_02);
              }
            }
          }
        }
      }
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"depth",
             "Test bounding box depth component");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (group._4_4_ = 0; group._4_4_ < 2; group._4_4_ = group._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::depthMethods[group._4_4_].name,init::depthMethods[group._4_4_].description);
    tcu::TestNode::addChild(pTVar2,pTVar3);
    for (blitFboGroup._4_4_ = 0; blitFboGroup._4_4_ < 4; blitFboGroup._4_4_ = blitFboGroup._4_4_ + 1
        ) {
      this_03 = (DepthDrawCase *)operator_new(200);
      lVar5 = (long)blitFboGroup._4_4_;
      anon_unknown_1::DepthDrawCase::DepthDrawCase
                (this_03,(this->super_TestCaseGroup).m_context,init::depthCases[lVar5].name,
                 init::depthCases[lVar5].description,init::depthMethods[group._4_4_].depthMethod,
                 init::depthCases[lVar5].bboxState,init::depthCases[lVar5].bboxSize);
      tcu::TestNode::addChild(pTVar3,(TestNode *)this_03);
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"blit_fbo",
             "Test bounding box does not affect blitting");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pBVar6 = (BlitFboCase *)operator_new(0x100);
  anon_unknown_1::BlitFboCase::BlitFboCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"blit_default_to_fbo",
             "Blit from default fb to fbo",TARGET_DEFAULT,TARGET_FBO);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pBVar6);
  pBVar6 = (BlitFboCase *)operator_new(0x100);
  anon_unknown_1::BlitFboCase::BlitFboCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"blit_fbo_to_default",
             "Blit from fbo to default fb",TARGET_FBO,TARGET_DEFAULT);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pBVar6);
  pBVar6 = (BlitFboCase *)operator_new(0x100);
  anon_unknown_1::BlitFboCase::BlitFboCase
            (pBVar6,(this->super_TestCaseGroup).m_context,"blit_fbo_to_fbo","Blit from fbo to fbo",
             TARGET_FBO,TARGET_FBO);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pBVar6);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"clear",
             "Test bounding box does not clears");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"full_clear","Do full clears",0);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"full_clear_with_triangles",
             "Do full clears and render some geometry",2);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,
             "full_clear_with_triangles_per_primitive_bbox",
             "Do full clears and render some geometry",6);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"scissored_clear","Do scissored clears",1)
  ;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"scissored_clear_with_triangles",
             "Do scissored clears and render some geometry",3);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,
             "scissored_clear_with_triangles_per_primitive_bbox",
             "Do scissored clears and render some geometry",7);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"scissored_full_clear",
             "Do full clears with enabled scissor",9);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,"scissored_full_clear_with_triangles",
             "Do full clears with enabled scissor and render some geometry",0xb);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pCVar7 = (ClearCase *)operator_new(0xe0);
  anon_unknown_1::ClearCase::ClearCase
            (pCVar7,(this->super_TestCaseGroup).m_context,
             "scissored_full_clear_with_triangles_per_primitive_bbox",
             "Do full clears with enabled scissor and render some geometry",0xf);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pCVar7);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"call_order",
             "Test viewport and bounding box calls have no effect");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pVVar8 = (ViewportCallOrderCase *)operator_new(0xa8);
  anon_unknown_1::ViewportCallOrderCase::ViewportCallOrderCase
            (pVVar8,(this->super_TestCaseGroup).m_context,"viewport_first_bbox_second",
             "Set up viewport first and bbox after",VIEWPORT_FIRST);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pVVar8);
  pVVar8 = (ViewportCallOrderCase *)operator_new(0xa8);
  anon_unknown_1::ViewportCallOrderCase::ViewportCallOrderCase
            (pVVar8,(this->super_TestCaseGroup).m_context,"bbox_first_viewport_second",
             "Set up bbox first and viewport after",BBOX_FIRST);
  tcu::TestNode::addChild(pTVar2,(TestNode *)pVVar8);
  return extraout_EAX;
}

Assistant:

void PrimitiveBoundingBoxTests::init (void)
{
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	methodFlags;
	} stateSetMethods[] =
	{
		{
			"global_state",
			"Set bounding box using PRIMITIVE_BOUNDING_BOX_EXT state",
			BBoxRenderCase::FLAG_SET_BBOX_STATE,
		},
		{
			"tessellation_set_per_draw",
			"Set bounding box using gl_BoundingBoxEXT, use same value for all primitives",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT,
		},
		{
			"tessellation_set_per_primitive",
			"Set bounding box using gl_BoundingBoxEXT, use per-primitive bounding box",
			BBoxRenderCase::FLAG_SET_BBOX_OUTPUT | BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	stageFlags;
	} pipelineConfigs[] =
	{
		{
			"vertex_fragment",
			"Render with vertex-fragment program",
			0u
		},
		{
			"vertex_tessellation_fragment",
			"Render with vertex-tessellation{ctrl,eval}-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION
		},
		{
			"vertex_geometry_fragment",
			"Render with vertex-tessellation{ctrl,eval}-geometry-fragment program",
			BBoxRenderCase::FLAG_GEOMETRY
		},
		{
			"vertex_tessellation_geometry_fragment",
			"Render with vertex-geometry-fragment program",
			BBoxRenderCase::FLAG_TESSELLATION | BBoxRenderCase::FLAG_GEOMETRY
		},
	};
	static const struct
	{
		const char*	name;
		const char*	description;
		deUint32	flags;
		deUint32	invalidFlags;
		deUint32	requiredFlags;
	} usageConfigs[] =
	{
		{
			"default_framebuffer_bbox_equal",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_larger",
			"Render to default framebuffer, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer_bbox_smaller",
			"Render to default framebuffer, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_equal",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_larger",
			"Render to texture, set padded bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_LARGER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"fbo_bbox_smaller",
			"Render to texture, set too small bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_SMALLER,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX,
			0
		},
		{
			"default_framebuffer",
			"Render to default framebuffer, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_DEFAULT | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
		{
			"fbo",
			"Render to texture, set tight bounding box",
			BBoxRenderCase::FLAG_RENDERTARGET_FBO | BBoxRenderCase::FLAG_BBOXSIZE_EQUAL,
			0,
			BBoxRenderCase::FLAG_PER_PRIMITIVE_BBOX
		},
	};
	enum PrimitiveRenderType
	{
		TYPE_TRIANGLE,
		TYPE_LINE,
		TYPE_POINT,
	};
	const struct
	{
		const char*			name;
		const char*			description;
		PrimitiveRenderType	type;
		deUint32			flags;
	} primitiveTypes[] =
	{
		{
			"triangles",
			"Triangle render tests",
			TYPE_TRIANGLE,
			0
		},
		{
			"lines",
			"Line render tests",
			TYPE_LINE,
			0
		},
		{
			"points",
			"Point render tests",
			TYPE_POINT,
			0
		},
		{
			"wide_lines",
			"Wide line render tests",
			TYPE_LINE,
			LineRenderCase::LINEFLAG_WIDE
		},
		{
			"wide_points",
			"Wide point render tests",
			TYPE_POINT,
			PointRenderCase::POINTFLAG_WIDE
		},
	};

	// .state_query
	{
		tcu::TestCaseGroup* const stateQueryGroup = new tcu::TestCaseGroup(m_testCtx, "state_query", "State queries");
		addChild(stateQueryGroup);

		stateQueryGroup->addChild(new InitialValueCase	(m_context,	"initial_value",	"Initial value case"));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getfloat",			"getFloatv",			QueryCase::QUERY_FLOAT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getboolean",		"getBooleanv",			QueryCase::QUERY_BOOLEAN));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger",		"getIntegerv",			QueryCase::QUERY_INT));
		stateQueryGroup->addChild(new QueryCase			(m_context,	"getinteger64",		"getInteger64v",		QueryCase::QUERY_INT64));
	}

	// .triangles
	// .(wide_)lines
	// .(wide_)points
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	{
		tcu::TestCaseGroup* const primitiveGroup = new tcu::TestCaseGroup(m_testCtx, primitiveTypes[primitiveTypeNdx].name, primitiveTypes[primitiveTypeNdx].description);
		addChild(primitiveGroup);

		for (int stateSetMethodNdx = 0; stateSetMethodNdx < DE_LENGTH_OF_ARRAY(stateSetMethods); ++stateSetMethodNdx)
		{
			tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, stateSetMethods[stateSetMethodNdx].name, stateSetMethods[stateSetMethodNdx].description);
			primitiveGroup->addChild(methodGroup);

			for (int pipelineConfigNdx = 0; pipelineConfigNdx < DE_LENGTH_OF_ARRAY(pipelineConfigs); ++pipelineConfigNdx)
			{
				if ((stateSetMethods[stateSetMethodNdx].methodFlags & BBoxRenderCase::FLAG_SET_BBOX_OUTPUT) != 0 &&
					(pipelineConfigs[pipelineConfigNdx].stageFlags  & BBoxRenderCase::FLAG_TESSELLATION)    == 0)
				{
					// invalid config combination
				}
				else
				{
					tcu::TestCaseGroup* const pipelineGroup = new tcu::TestCaseGroup(m_testCtx, pipelineConfigs[pipelineConfigNdx].name, pipelineConfigs[pipelineConfigNdx].description);
					methodGroup->addChild(pipelineGroup);

					for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageConfigs); ++usageNdx)
					{
						const deUint32 flags = primitiveTypes[primitiveTypeNdx].flags         |
											   stateSetMethods[stateSetMethodNdx].methodFlags |
											   pipelineConfigs[pipelineConfigNdx].stageFlags  |
											   usageConfigs[usageNdx].flags;

						if (usageConfigs[usageNdx].invalidFlags && (flags & usageConfigs[usageNdx].invalidFlags) != 0)
							continue;
						if (usageConfigs[usageNdx].requiredFlags && (flags & usageConfigs[usageNdx].requiredFlags) == 0)
							continue;

						switch (primitiveTypes[primitiveTypeNdx].type)
						{
							case TYPE_TRIANGLE:
								pipelineGroup->addChild(new GridRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_LINE:
								pipelineGroup->addChild(new LineRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							case TYPE_POINT:
								pipelineGroup->addChild(new PointRenderCase(m_context, usageConfigs[usageNdx].name, usageConfigs[usageNdx].description, flags));
								break;
							default:
								DE_ASSERT(false);
						}
					}
				}
			}
		}
	}

	// .depth
	{
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::DepthType	depthMethod;
		} depthMethods[] =
		{
			{
				"builtin_depth",
				"Fragment depth not modified in fragment shader",
				DepthDrawCase::DEPTH_BUILTIN
			},
			{
				"user_defined_depth",
				"Fragment depth is defined in the fragment shader",
				DepthDrawCase::DEPTH_USER_DEFINED
			},
		};
		static const struct
		{
			const char*					name;
			const char*					description;
			DepthDrawCase::BBoxState	bboxState;
			DepthDrawCase::BBoxSize		bboxSize;
		} depthCases[] =
		{
			{
				"global_state_bbox_equal",
				"Test tight bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"global_state_bbox_larger",
				"Test padded bounding box with global bbox state",
				DepthDrawCase::STATE_GLOBAL,
				DepthDrawCase::BBOX_LARGER,
			},
			{
				"per_primitive_bbox_equal",
				"Test tight bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_EQUAL,
			},
			{
				"per_primitive_bbox_larger",
				"Test padded bounding box with tessellation output bbox",
				DepthDrawCase::STATE_PER_PRIMITIVE,
				DepthDrawCase::BBOX_LARGER,
			},
		};

		tcu::TestCaseGroup* const depthGroup = new tcu::TestCaseGroup(m_testCtx, "depth", "Test bounding box depth component");
		addChild(depthGroup);

		// .builtin_depth
		// .user_defined_depth
		for (int depthNdx = 0; depthNdx < DE_LENGTH_OF_ARRAY(depthMethods); ++depthNdx)
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, depthMethods[depthNdx].name, depthMethods[depthNdx].description);
			depthGroup->addChild(group);

			for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(depthCases); ++caseNdx)
				group->addChild(new DepthDrawCase(m_context, depthCases[caseNdx].name, depthCases[caseNdx].description, depthMethods[depthNdx].depthMethod, depthCases[caseNdx].bboxState, depthCases[caseNdx].bboxSize));
		}
	}

	// .blit_fbo
	{
		tcu::TestCaseGroup* const blitFboGroup = new tcu::TestCaseGroup(m_testCtx, "blit_fbo", "Test bounding box does not affect blitting");
		addChild(blitFboGroup);

		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_default_to_fbo", "Blit from default fb to fbo", BlitFboCase::TARGET_DEFAULT, BlitFboCase::TARGET_FBO));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_default", "Blit from fbo to default fb", BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_DEFAULT));
		blitFboGroup->addChild(new BlitFboCase(m_context, "blit_fbo_to_fbo",     "Blit from fbo to fbo",        BlitFboCase::TARGET_FBO,     BlitFboCase::TARGET_FBO));
	}

	// .clear
	{
		tcu::TestCaseGroup* const clearGroup = new tcu::TestCaseGroup(m_testCtx, "clear", "Test bounding box does not clears");
		addChild(clearGroup);

		clearGroup->addChild(new ClearCase(m_context, "full_clear",                                             "Do full clears",                                               0));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles",                              "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "full_clear_with_triangles_per_primitive_bbox",           "Do full clears and render some geometry",                      ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear",                                        "Do scissored clears",                                          ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles",                         "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_clear_with_triangles_per_primitive_bbox",      "Do scissored clears and render some geometry",                 ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear",                                   "Do full clears with enabled scissor",                          ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles",                    "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT));
		clearGroup->addChild(new ClearCase(m_context, "scissored_full_clear_with_triangles_per_primitive_bbox", "Do full clears with enabled scissor and render some geometry", ClearCase::FULLSCREEN_SCISSOR_BIT | ClearCase::SCISSOR_CLEAR_BIT | ClearCase::DRAW_TRIANGLE_BIT | ClearCase::PER_PRIMITIVE_BBOX_BIT));
	}

	// .call_order (Khronos bug #13262)
	{
		tcu::TestCaseGroup* const callOrderGroup = new tcu::TestCaseGroup(m_testCtx, "call_order", "Test viewport and bounding box calls have no effect");
		addChild(callOrderGroup);

		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "viewport_first_bbox_second", "Set up viewport first and bbox after", ViewportCallOrderCase::VIEWPORT_FIRST));
		callOrderGroup->addChild(new ViewportCallOrderCase(m_context, "bbox_first_viewport_second", "Set up bbox first and viewport after", ViewportCallOrderCase::BBOX_FIRST));
	}
}